

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.h
# Opt level: O0

void __thiscall
vkb::detail::GenericFeatureChain::GenericFeatureChain
          (GenericFeatureChain *this,GenericFeatureChain *param_1)

{
  GenericFeatureChain *param_1_local;
  GenericFeatureChain *this_local;
  
  std::
  vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
  ::vector(&this->nodes,&param_1->nodes);
  return;
}

Assistant:

void add(T const& features) noexcept {
        // If this struct is already in the list, combine it
        for (auto& node : nodes) {
            if (static_cast<VkStructureType>(features.sType) == node.sType) {
                node.combine(features);
                return;
            }
        }
        // Otherwise append to the end
        nodes.push_back(features);
    }